

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

pointer gmlc::networking::TcpServer::create
                  (io_context *io_context,uint16_t portNum,int nominalBufferSize)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  pointer pVar1;
  int in_stack_ffffffffffffffb8;
  uint16_t in_stack_ffffffffffffffbe;
  io_context *in_stack_ffffffffffffffc0;
  SocketFactory *sf;
  
  sf = (SocketFactory *)0x0;
  SocketFactory::SocketFactory((SocketFactory *)in_RDI);
  create(sf,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8);
  SocketFactory::~SocketFactory((SocketFactory *)0x781071);
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (pointer)pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpServer::pointer TcpServer::create(
    asio::io_context& io_context,
    uint16_t portNum,
    int nominalBufferSize)
{
    return TcpServer::create(
        SocketFactory(), io_context, portNum, nominalBufferSize);
}